

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<double,_8>::Resize(TPZManVector<double,_8> *this,int64_t newsize,double *object)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int64_t i;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar9 = (this->super_TPZVec<double>).fNElements;
  if (lVar9 != newsize) {
    lVar5 = (this->super_TPZVec<double>).fNAlloc;
    if (lVar5 < newsize) {
      if (newsize < 9) {
        if (lVar9 < 1) {
          lVar9 = 0;
        }
        else {
          pdVar4 = (this->super_TPZVec<double>).fStore;
          lVar5 = 0;
          do {
            this->fExtAlloc[lVar5] = pdVar4[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar9 != lVar5);
        }
        if (lVar9 < newsize) {
          do {
            this->fExtAlloc[lVar9] = *object;
            lVar9 = lVar9 + 1;
          } while (newsize != lVar9);
        }
        pdVar4 = (this->super_TPZVec<double>).fStore;
        if (pdVar4 != (double *)0x0 && pdVar4 != this->fExtAlloc) {
          operator_delete__(pdVar4);
        }
        (this->super_TPZVec<double>).fStore = this->fExtAlloc;
        (this->super_TPZVec<double>).fNElements = newsize;
        (this->super_TPZVec<double>).fNAlloc = 8;
      }
      else {
        dVar10 = (double)lVar5 * 1.2;
        uVar6 = (long)dVar10;
        if (dVar10 < (double)newsize) {
          uVar6 = newsize;
        }
        pdVar4 = (double *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
        lVar5 = 0;
        if (0 < lVar9) {
          pdVar1 = (this->super_TPZVec<double>).fStore;
          lVar7 = 0;
          do {
            pdVar4[lVar7] = pdVar1[lVar7];
            lVar7 = lVar7 + 1;
            lVar5 = lVar9;
          } while (lVar9 != lVar7);
        }
        auVar3 = _DAT_014f8350;
        auVar2 = _DAT_014f8340;
        lVar9 = newsize - lVar5;
        if (lVar9 != 0 && lVar5 <= newsize) {
          dVar10 = *object;
          lVar7 = lVar9 + -1;
          auVar11._8_4_ = (int)lVar7;
          auVar11._0_8_ = lVar7;
          auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
          uVar8 = 0;
          auVar11 = auVar11 ^ _DAT_014f8350;
          do {
            auVar12._8_4_ = (int)uVar8;
            auVar12._0_8_ = uVar8;
            auVar12._12_4_ = (int)(uVar8 >> 0x20);
            auVar12 = (auVar12 | auVar2) ^ auVar3;
            if ((bool)(~(auVar12._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar12._0_4_ ||
                        auVar11._4_4_ < auVar12._4_4_) & 1)) {
              pdVar4[lVar5 + uVar8] = dVar10;
            }
            if ((auVar12._12_4_ != auVar11._12_4_ || auVar12._8_4_ <= auVar11._8_4_) &&
                auVar12._12_4_ <= auVar11._12_4_) {
              pdVar4[lVar5 + uVar8 + 1] = dVar10;
            }
            uVar8 = uVar8 + 2;
          } while ((lVar9 + 1U & 0xfffffffffffffffe) != uVar8);
        }
        pdVar1 = (this->super_TPZVec<double>).fStore;
        if (pdVar1 != (double *)0x0 && pdVar1 != this->fExtAlloc) {
          operator_delete__(pdVar1);
        }
        (this->super_TPZVec<double>).fStore = pdVar4;
        (this->super_TPZVec<double>).fNElements = newsize;
        (this->super_TPZVec<double>).fNAlloc = uVar6;
      }
    }
    else {
      if (lVar9 < newsize) {
        pdVar4 = (this->super_TPZVec<double>).fStore;
        do {
          pdVar4[lVar9] = *object;
          lVar9 = lVar9 + 1;
        } while (newsize != lVar9);
      }
      (this->super_TPZVec<double>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}